

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

char * make_dirname(char *pi_name,char **logtext)

{
  bool bVar1;
  int __fd;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *dirname;
  char *pcVar6;
  int *piVar7;
  char *pcVar8;
  ssize_t sVar9;
  char *pcVar10;
  char *pcVar11;
  ssh_hash *psVar12;
  char *fmt;
  ulong uVar13;
  long lVar14;
  uchar digest [32];
  uchar saltbuf [64];
  char retbuf [65];
  byte local_d8 [32];
  undefined1 local_b8 [64];
  char local_78 [72];
  
  pcVar5 = get_username();
  dirname = dupprintf("%s.%s","/tmp/putty-connshare",pcVar5);
  safefree(pcVar5);
  if (*dirname != '/') {
    __assert_fail("*parent == \'/\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                  ,0x24,"char *make_parentdir_name(void)");
  }
  pcVar5 = make_dir_and_check_ours(dirname);
  if (pcVar5 != (char *)0x0) {
    *logtext = pcVar5;
    safefree(dirname);
    return (char *)0x0;
  }
  pcVar5 = (char *)0x0;
  pcVar6 = dupprintf("%s/%s",dirname,"salt");
  __fd = open(pcVar6,0);
  if (__fd < 0) {
    piVar7 = __errno_location();
    if (*piVar7 == 2) {
      uVar2 = getpid();
      pcVar8 = dupprintf("%s/%s.tmp.%d.%d",dirname,"salt",(ulong)uVar2,0);
      __fd = open(pcVar8,0xc1,0x100);
      if (__fd < 0) {
        iVar4 = *piVar7;
        if (iVar4 == 0x11) {
          uVar13 = 1;
          do {
            safefree(pcVar8);
            pcVar8 = dupprintf("%s/%s.tmp.%d.%d",dirname,"salt",(ulong)uVar2,uVar13);
            __fd = open(pcVar8,0xc1,0x100);
            if (-1 < __fd) goto LAB_00138f34;
            iVar4 = *piVar7;
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (iVar4 == 0x11);
        }
        pcVar11 = strerror(iVar4);
        pcVar11 = dupprintf("%s: open: %s",pcVar8,pcVar11);
        *logtext = pcVar11;
        safefree(pcVar8);
        goto LAB_00139100;
      }
LAB_00138f34:
      random_read(local_b8,0x40);
      sVar9 = write(__fd,local_b8,0x40);
      iVar4 = (int)sVar9;
      if (iVar4 != 0x40 && -1 < iVar4) {
        __assert_fail("ret < 0 || ret == SALT_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                      ,0x80,"char *make_dirname(const char *, char **)");
      }
      iVar3 = close(__fd);
      pcVar11 = pcVar8;
      if (iVar4 < 0) {
        pcVar10 = strerror(*piVar7);
        fmt = "%s: write: %s";
LAB_001390e4:
        pcVar11 = dupprintf(fmt,pcVar11,pcVar10);
        *logtext = pcVar11;
        safefree(pcVar8);
        goto LAB_00139100;
      }
      if (iVar3 < 0) {
        pcVar10 = strerror(*piVar7);
        fmt = "%s: close: %s";
        goto LAB_001390e4;
      }
      iVar4 = link(pcVar8,pcVar6);
      if ((iVar4 < 0) && (*piVar7 != 0x11)) {
        pcVar10 = strerror(*piVar7);
        fmt = "%s: link: %s";
        pcVar11 = pcVar6;
        goto LAB_001390e4;
      }
      iVar4 = unlink(pcVar8);
      if (iVar4 < 0) {
        pcVar10 = strerror(*piVar7);
        fmt = "%s: unlink: %s";
        goto LAB_001390e4;
      }
      safefree(pcVar8);
      __fd = open(pcVar6,0);
      bVar1 = true;
      if (__fd < 0) {
        pcVar8 = strerror(*piVar7);
        pcVar8 = dupprintf("%s: open: %s",pcVar6,pcVar8);
        goto LAB_00138ff6;
      }
    }
    else {
      pcVar8 = strerror(*piVar7);
      pcVar8 = dupprintf("%s: open: %s",pcVar6,pcVar8);
LAB_00138ff6:
      *logtext = pcVar8;
LAB_00139100:
      safefree(pcVar6);
      safefree(dirname);
      bVar1 = false;
    }
    if (!bVar1) {
      bVar1 = false;
      goto LAB_00139269;
    }
  }
  do {
    sVar9 = read(__fd,local_b8,0x40);
    iVar4 = (int)sVar9;
    if (iVar4 < 1) {
      close(__fd);
      if (iVar4 == 0) {
        pcVar5 = "unexpected EOF";
      }
      else {
        piVar7 = __errno_location();
        pcVar5 = strerror(*piVar7);
      }
      bVar1 = false;
      pcVar5 = dupprintf("%s: read: %s",pcVar6,pcVar5);
      *logtext = pcVar5;
      safefree(pcVar6);
      safefree(dirname);
      pcVar5 = pcVar6;
      goto LAB_00139269;
    }
    if (0x40 - (int)pcVar5 < iVar4) {
      __assert_fail("0 < ret && ret <= SALT_SIZE - i",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                    ,0xcb,"char *make_dirname(const char *, char **)");
    }
    uVar2 = (int)pcVar5 + iVar4 + 1;
    pcVar5 = (char *)(ulong)uVar2;
  } while ((int)uVar2 < 0x40);
  close(__fd);
  safefree(pcVar6);
  psVar12 = sha256_select(&ssh_sha256);
  if (psVar12 != (ssh_hash *)0x0) {
    (*psVar12->vt->reset)(psVar12);
  }
  BinarySink_put_string(psVar12->binarysink_,local_b8,0x40);
  BinarySink_put_stringz(psVar12->binarysink_,pi_name);
  (*psVar12->vt->digest)(psVar12,local_d8);
  (*psVar12->vt->free)(psVar12);
  pcVar5 = local_78;
  lVar14 = 0;
  do {
    sprintf(pcVar5,"%02x",(ulong)local_d8[lVar14]);
    lVar14 = lVar14 + 1;
    pcVar5 = pcVar5 + 2;
  } while (lVar14 != 0x20);
  pcVar5 = dupstr(local_78);
  smemclr(local_b8,0x40);
  bVar1 = true;
LAB_00139269:
  if (!bVar1) {
    return (char *)0x0;
  }
  pcVar6 = dupprintf("%s/%s",dirname,pcVar5);
  safefree(dirname);
  safefree(pcVar5);
  return pcVar6;
}

Assistant:

static char *make_dirname(const char *pi_name, char **logtext)
{
    char *name, *parentdirname, *dirname, *err;

    /*
     * First, create the top-level directory for all shared PuTTY
     * connections owned by this user.
     */
    parentdirname = make_parentdir_name();
    if ((err = make_dir_and_check_ours(parentdirname)) != NULL) {
        *logtext = err;
        sfree(parentdirname);
        return NULL;
    }

    /*
     * Transform the platform-independent version of the connection
     * identifier into the name we'll actually use for the directory
     * containing the Unix socket.
     *
     * We do this by hashing the identifier with some user-specific
     * secret information, to avoid the privacy leak of having
     * "user@host" strings show up in 'netstat -x'. (Irritatingly, the
     * full pathname of a Unix-domain socket _does_ show up in the
     * 'netstat -x' output, at least on Linux, even if that socket is
     * in a directory not readable to the user running netstat. You'd
     * think putting things inside an 0700 directory would hide their
     * names from other users, but no.)
     *
     * The secret information we use to salt the hash lives in a file
     * inside the top-level directory we just created, so we must
     * first create that file (with some fresh random data in it) if
     * it's not already been done by a previous PuTTY.
     */
    {
        unsigned char saltbuf[SALT_SIZE];
        char *saltname;
        int saltfd, i, ret;

        saltname = dupprintf("%s/%s", parentdirname, SALT_FILENAME);
        saltfd = open(saltname, O_RDONLY);
        if (saltfd < 0) {
            char *tmpname;
            int pid;

            if (errno != ENOENT) {
                *logtext = dupprintf("%s: open: %s", saltname,
                                     strerror(errno));
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * The salt file doesn't already exist, so try to create
             * it. Another process may be attempting the same thing
             * simultaneously, so we must do this carefully: we write
             * a salt file under a different name, then hard-link it
             * into place, which guarantees that we won't change the
             * contents of an existing salt file.
             */
            pid = getpid();
            for (i = 0;; i++) {
                tmpname = dupprintf("%s/%s.tmp.%d.%d",
                                    parentdirname, SALT_FILENAME, pid, i);
                saltfd = open(tmpname, O_WRONLY | O_EXCL | O_CREAT, 0400);
                if (saltfd >= 0)
                    break;
                if (errno != EEXIST) {
                    *logtext = dupprintf("%s: open: %s", tmpname,
                                         strerror(errno));
                    sfree(tmpname);
                    sfree(saltname);
                    sfree(parentdirname);
                    return NULL;
                }
                sfree(tmpname);        /* go round and try again with i+1 */
            }
            /*
             * Invent some random data.
             */
            random_read(saltbuf, SALT_SIZE);
            ret = write(saltfd, saltbuf, SALT_SIZE);
            /* POSIX atomicity guarantee: because we wrote less than
             * PIPE_BUF bytes, the write either completed in full or
             * failed. */
            assert(SALT_SIZE < PIPE_BUF);
            assert(ret < 0 || ret == SALT_SIZE);
            if (ret < 0) {
                close(saltfd);
                *logtext = dupprintf("%s: write: %s", tmpname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }
            if (close(saltfd) < 0) {
                *logtext = dupprintf("%s: close: %s", tmpname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * Now attempt to hard-link our temp file into place. We
             * tolerate EEXIST as an outcome, because that just means
             * another PuTTY got their attempt in before we did (and
             * we only care that there is a valid salt file we can
             * agree on, no matter who created it).
             */
            if (link(tmpname, saltname) < 0 && errno != EEXIST) {
                *logtext = dupprintf("%s: link: %s", saltname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * Whether that succeeded or not, get rid of our temp file.
             */
            if (unlink(tmpname) < 0) {
                *logtext = dupprintf("%s: unlink: %s", tmpname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * And now we've arranged for there to be a salt file, so
             * we can try to open it for reading again and this time
             * expect it to work.
             */
            sfree(tmpname);

            saltfd = open(saltname, O_RDONLY);
            if (saltfd < 0) {
                *logtext = dupprintf("%s: open: %s", saltname,
                                     strerror(errno));
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }
        }

        for (i = 0; i < SALT_SIZE; i++) {
            ret = read(saltfd, saltbuf, SALT_SIZE);
            if (ret <= 0) {
                close(saltfd);
                *logtext = dupprintf("%s: read: %s", saltname,
                                     ret == 0 ? "unexpected EOF" :
                                     strerror(errno));
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }
            assert(0 < ret && ret <= SALT_SIZE - i);
            i += ret;
        }

        close(saltfd);
        sfree(saltname);

        /*
         * Now we've got our salt, hash it with the connection
         * identifier to produce our actual socket name.
         */
        {
            unsigned char digest[32];
            char retbuf[65];

            ssh_hash *h = ssh_hash_new(&ssh_sha256);
            put_string(h, saltbuf, SALT_SIZE);
            put_stringz(h, pi_name);
            ssh_hash_final(h, digest);

            /*
             * And make it printable.
             */
            for (i = 0; i < 32; i++) {
                sprintf(retbuf + 2*i, "%02x", digest[i]);
                /* the last of those will also write the trailing NUL */
            }

            name = dupstr(retbuf);
        }

        smemclr(saltbuf, sizeof(saltbuf));
    }

    dirname = dupprintf("%s/%s", parentdirname, name);
    sfree(parentdirname);
    sfree(name);

    return dirname;
}